

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O3

void __thiscall Eigen::internal::CacheSizes::CacheSizes(CacheSizes *this)

{
  int iVar1;
  int l3CacheSize;
  int l2CacheSize;
  int l1CacheSize;
  int local_2c;
  int local_28;
  int local_24;
  
  *(undefined4 *)&this->m_l1 = 0xffffffff;
  *(undefined4 *)((long)&this->m_l1 + 4) = 0xffffffff;
  *(undefined4 *)&this->m_l2 = 0xffffffff;
  *(undefined4 *)((long)&this->m_l2 + 4) = 0xffffffff;
  this->m_l3 = -1;
  queryCacheSizes(&local_24,&local_28,&local_2c);
  iVar1 = 0x8000;
  if (0 < local_24) {
    iVar1 = local_24;
  }
  this->m_l1 = (long)iVar1;
  iVar1 = 0x40000;
  if (0 < local_28) {
    iVar1 = local_28;
  }
  this->m_l2 = (long)iVar1;
  iVar1 = 0x200000;
  if (0 < local_2c) {
    iVar1 = local_2c;
  }
  this->m_l3 = (long)iVar1;
  return;
}

Assistant:

CacheSizes(): m_l1(-1),m_l2(-1),m_l3(-1) {
    int l1CacheSize, l2CacheSize, l3CacheSize;
    queryCacheSizes(l1CacheSize, l2CacheSize, l3CacheSize);
    m_l1 = manage_caching_sizes_helper(l1CacheSize, defaultL1CacheSize);
    m_l2 = manage_caching_sizes_helper(l2CacheSize, defaultL2CacheSize);
    m_l3 = manage_caching_sizes_helper(l3CacheSize, defaultL3CacheSize);
  }